

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,SQChar *filename)

{
  FILE *__stream;
  SQRESULT SVar1;
  
  __stream = fopen(filename,"wb+");
  if (__stream != (FILE *)0x0) {
    SVar1 = sq_writeclosure(v,file_write,__stream);
    fclose(__stream);
    return SVar1 >> 0x3f;
  }
  SVar1 = sq_throwerror(v,"cannot open the file");
  return SVar1;
}

Assistant:

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,const SQChar *filename)
{
    SQFILE file = sqstd_fopen(filename,_SC("wb+"));
    if(!file) return sq_throwerror(v,_SC("cannot open the file"));
    if(SQ_SUCCEEDED(sq_writeclosure(v,file_write,file))) {
        sqstd_fclose(file);
        return SQ_OK;
    }
    sqstd_fclose(file);
    return SQ_ERROR; //forward the error
}